

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O3

DSFrame * __thiscall DSFrame::operator=(DSFrame *this,DSFrame *old)

{
  VSFrameRef *pVVar1;
  code *pcVar2;
  VSFrameRef *pVVar3;
  long *plVar4;
  
  if (old != this) {
    if (this->SrcPointers != (uchar **)0x0) {
      operator_delete__(this->SrcPointers);
    }
    if (this->DstPointers != (uchar **)0x0) {
      operator_delete__(this->DstPointers);
    }
    if (this->StrideBytes != (int *)0x0) {
      operator_delete__(this->StrideBytes);
    }
    pVVar3 = this->_vssrc;
    pVVar1 = this->_vsdst;
    if (pVVar1 != pVVar3 && pVVar1 != (VSFrameRef *)0x0) {
      (*this->_vsapi->freeFrame)(pVVar1);
      pVVar3 = this->_vssrc;
    }
    if (pVVar3 != (VSFrameRef *)0x0) {
      (*this->_vsapi->freeFrame)(pVVar3);
    }
    if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x428 < (uint)AVS_linkage->Size)) {
      pcVar2 = (code *)AVS_linkage->PVideoFrame_OPERATOR_ASSIGN1;
      plVar4 = (long *)((long)this->planes_y + *(long *)&AVS_linkage->field_0x430 + -0x40);
      if (((ulong)pcVar2 & 1) != 0) {
        pcVar2 = *(code **)(pcVar2 + *plVar4 + -1);
      }
      (*pcVar2)(plVar4,&old->_avssrc);
    }
    memcpy(this,old,0xd0);
    old->SrcPointers = (uchar **)0x0;
    old->StrideBytes = (int *)0x0;
    old->DstPointers = (uchar **)0x0;
    old->_vssrc = (VSFrameRef *)0x0;
    old->_vsdst = (VSFrameRef *)0x0;
  }
  return this;
}

Assistant:

DSFrame& operator =(DSFrame && old) noexcept
  {
    if (&old == this)
      return *this;

    if (SrcPointers)
      delete[] SrcPointers;
    if (DstPointers)
      delete[] DstPointers;
    if (StrideBytes)
      delete[] StrideBytes;
    if (_vsdst && _vsdst != _vssrc)
      _vsapi->freeFrame(_vsdst);
    if (_vssrc)
      _vsapi->freeFrame(_vssrc);

    _avssrc = old._avssrc;
    std::memcpy(this, &old, sizeof(DSFrame));
    old.SrcPointers = nullptr;
    old.DstPointers = nullptr;
    old.StrideBytes = nullptr;
    old._vssrc = nullptr;
    old._vsdst = nullptr;
    return *this;
  }